

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackCase::deinit(VertexFeedbackCase *this)

{
  ShaderProgram *this_00;
  TypedObjectWrapper<(glu::ObjectType)5> *this_01;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  VertexFeedbackCase *this_local;
  
  if (this->m_elementBuf != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_elementBuf);
    this->m_elementBuf = 0;
  }
  if (this->m_arrayBuf != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_arrayBuf);
    this->m_arrayBuf = 0;
  }
  if (this->m_offsetBuf != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x438))(1,&this->m_offsetBuf);
    this->m_offsetBuf = 0;
  }
  if (this->m_feedbackBuf != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x438))(1,&this->m_feedbackBuf);
    this->m_feedbackBuf = 0;
  }
  if (this->m_indirectBuffer != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar1) + 0x438))(1,&this->m_indirectBuffer);
    this->m_indirectBuffer = 0;
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  this_01 = this->m_vao;
  if (this_01 != (TypedObjectWrapper<(glu::ObjectType)5> *)0x0) {
    glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper(this_01);
    operator_delete(this_01,0x18);
  }
  this->m_vao = (VertexArray *)0x0;
  return;
}

Assistant:

void VertexFeedbackCase::deinit (void)
{
	if (m_elementBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_elementBuf);
		m_elementBuf = 0;
	}

	if (m_arrayBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_arrayBuf);
		m_arrayBuf = 0;
	}

	if (m_offsetBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_offsetBuf);
		m_offsetBuf = 0;
	}

	if (m_feedbackBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_feedbackBuf);
		m_feedbackBuf = 0;
	}

	if (m_indirectBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_indirectBuffer);
		m_indirectBuffer = 0;
	}

	delete m_program;
	m_program = DE_NULL;

	delete m_vao;
	m_vao = DE_NULL;
}